

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

int64_t __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism>::ConnectIndex
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism> *this,int elem,int connect)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (elem < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = (long)elem;
    lVar3 = 0;
    iVar4 = 0;
    do {
      plVar1 = *(long **)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                         lVar3 * 4);
      if ((plVar1 != (long *)0x0) &&
         (*(int *)((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.super_TPZVec<int>.
                         fStore + lVar3) != 0)) {
        iVar2 = (**(code **)(*plVar1 + 0x90))();
        iVar4 = iVar4 + iVar2;
      }
      lVar3 = lVar3 + 4;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return (this->fConnectIndexes).fStore[iVar4 + connect];
}

Assistant:

int64_t TPZMultiphysicsCompEl<TGeometry>::ConnectIndex(int elem, int connect) const {
    
    int first = 0;
    for(int64_t el=0; el<elem; el++){
        TPZCompEl *cel = fElementVec[el].Element();
        if (cel && fActiveApproxSpace[el]) {
            first+=cel->NConnects();
        }
    }
    return fConnectIndexes[first+connect];
}